

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign_inliner.cpp
# Opt level: O1

unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> __thiscall
verilogAST::AssignInliner::visit
          (AssignInliner *this,
          unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *node)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  _func_int **pp_Var4;
  mapped_type *pmVar5;
  undefined4 extraout_var;
  long *in_RDX;
  _func_int **pp_Var6;
  string key;
  key_type local_70;
  string local_50;
  
  if (*in_RDX == 0) {
    pp_Var4 = (_func_int **)0x0;
  }
  else {
    pp_Var4 = (_func_int **)__dynamic_cast(*in_RDX,&Expression::typeinfo,&Identifier::typeinfo,0);
  }
  if (pp_Var4 != (_func_int **)0x0) {
    *in_RDX = 0;
    (**(code **)*pp_Var4)(&local_70,pp_Var4);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    bVar2 = can_inline((AssignInliner *)node,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                             *)(node + 0xd),&local_70);
      iVar3 = (*(((pmVar5->_M_t).
                  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                  .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)
                ._vptr_Node[3])();
      (*(code *)(((node->_M_t).
                  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                  .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node)
                ._vptr_Node)(this,node);
      pp_Var6 = pp_Var4;
      if ((long *)CONCAT44(extraout_var,iVar3) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))();
      }
    }
    else {
      (this->super_Transformer)._vptr_Transformer = pp_Var4;
      pp_Var6 = (_func_int **)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (pp_Var6 != (_func_int **)0x0) {
      (**(code **)(*pp_Var6 + 0x10))(pp_Var6);
    }
    if (pp_Var4 != (_func_int **)0x0) {
      return (unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>)this;
    }
  }
  plVar1 = (long *)*in_RDX;
  *in_RDX = 0;
  Transformer::visit(&this->super_Transformer,node);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  return (__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
          )(__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> AssignInliner::visit(
    std::unique_ptr<Expression> node) {
  if (auto ptr = dynamic_cast<Identifier*>(node.get())) {
    node.release();
    std::unique_ptr<Identifier> id(ptr);
    std::string key = id->toString();
    if (this->can_inline(key)) {
      return this->visit(assign_map[key]->clone());
    }
    return id;
  }
  return Transformer::visit(std::move(node));
}